

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item_Array::deparent(Fl_Tree_Item_Array *this,int pos)

{
  Fl_Tree_Item *this_00;
  Fl_Tree_Item *this_01;
  Fl_Tree_Item *this_02;
  int local_3c;
  int t;
  Fl_Tree_Item *next;
  Fl_Tree_Item *prev;
  Fl_Tree_Item *item;
  int pos_local;
  Fl_Tree_Item_Array *this_local;
  
  if ((pos < this->_total) && (-1 < pos)) {
    this_00 = this->_items[pos];
    this_01 = Fl_Tree_Item::prev_sibling(this_00);
    this_02 = Fl_Tree_Item::next_sibling(this_00);
    this->_total = this->_total + -1;
    for (local_3c = pos; local_3c < this->_total; local_3c = local_3c + 1) {
      this->_items[local_3c] = this->_items[local_3c + 1];
    }
    Fl_Tree_Item::update_prev_next(this_00,-1);
    if (this_01 != (Fl_Tree_Item *)0x0) {
      Fl_Tree_Item::update_prev_next(this_01,pos + -1);
    }
    if (this_02 != (Fl_Tree_Item *)0x0) {
      Fl_Tree_Item::update_prev_next(this_02,pos);
    }
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree_Item_Array::deparent(int pos) {
  if ( pos>=_total || pos<0 ) return -1;
  // Save item being deparented, and its two nearest siblings
  Fl_Tree_Item *item = _items[pos];
  Fl_Tree_Item *prev = item->prev_sibling();
  Fl_Tree_Item *next = item->next_sibling();
  // Remove from parent's list of children
  _total -= 1;
  for ( int t=pos; t<_total; t++ )
    _items[t] = _items[t+1];            // delete, no destroy
  // Now an orphan: remove association with old parent and siblings
  item->update_prev_next(-1);           // become an orphan
  // Adjust bereaved siblings
  if ( prev ) prev->update_prev_next(pos-1);
  if ( next ) next->update_prev_next(pos);
  return 0;
}